

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::cm
          (AbstractContentContext *this,double inA,double inB,double inC,double inD,double inE,
          double inF)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  allocator<char> local_69;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  string local_38;
  
  local_68 = inA;
  local_60 = inB;
  local_58 = inC;
  local_50 = inD;
  local_48 = inE;
  local_40 = inF;
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,local_68,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_60,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_58,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_50,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_48,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_40,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"cm",&local_69);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::cm(double inA, double inB, double inC, double inD, double inE, double inF)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inA);
	mPrimitiveWriter.WriteDouble(inB);
	mPrimitiveWriter.WriteDouble(inC);
	mPrimitiveWriter.WriteDouble(inD);
	mPrimitiveWriter.WriteDouble(inE);
	mPrimitiveWriter.WriteDouble(inF);
	mPrimitiveWriter.WriteKeyword("cm");
	return GetCurrentStatusCode();
}